

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Parser::StringLiteral(Parser *this,ASTNode **node)

{
  Symbol *pSVar1;
  
  pSVar1 = Semantics::NewSymbol(&this->semantics,node);
  std::__cxx11::string::_M_assign((string *)pSVar1);
  pSVar1->datatype = string;
  pSVar1->kind = literal;
  return;
}

Assistant:

void Parser::StringLiteral(ASTNode*& node)
{
	Symbol* sym = semantics.NewSymbol(node);
	sym->id = node->token->payload;
	sym->datatype = SymbolDataType::string;
	sym->kind = SymbolKind::literal; // literals are temporarly stored on the stack(with no particular reference).
	//semantics.AddSymbol(sym);
}